

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_white_noise_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,float factor,rf_rand_proc rand,
          rf_color *dst,rf_int dst_size)

{
  rf_color *prVar1;
  int iVar2;
  rf_int rVar3;
  undefined4 uStack_4c;
  long local_40;
  rf_int i;
  int result_image_size;
  rf_int dst_size_local;
  rf_color *dst_local;
  rf_rand_proc rand_local;
  float factor_local;
  int height_local;
  int width_local;
  
  iVar2 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  iVar2 = width * height * iVar2;
  memset(__return_storage_ptr__,0,0x18);
  if (((iVar2 <= dst_size) && (rand != (rf_rand_proc)0x0)) && (0 < iVar2)) {
    for (local_40 = 0; local_40 < width * height; local_40 = local_40 + 1) {
      rVar3 = (*rand)(0,99);
      if (rVar3 < (int)(factor * 100.0)) {
        prVar1 = dst + local_40;
        prVar1->r = 0xff;
        prVar1->g = 0xff;
        prVar1->b = 0xff;
        prVar1->a = 0xff;
      }
      else {
        prVar1 = dst + local_40;
        prVar1->r = '\0';
        prVar1->g = '\0';
        prVar1->b = '\0';
        prVar1->a = 0xff;
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = 7;
    __return_storage_ptr__->valid = true;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_4c._1_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_white_noise_to_buffer(int width, int height, float factor, rf_rand_proc rand, rf_color* dst, rf_int dst_size)
{
    int result_image_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    rf_image result = {0};

    if (dst_size < result_image_size || !rand || result_image_size <= 0) return result;

    for (rf_int i = 0; i < width * height; i++)
    {
        if (rand(0, 99) < (int)(factor * 100.0f))
        {
            dst[i] = RF_WHITE;
        }
        else
        {
            dst[i] = RF_BLACK;
        }
    }

    result = (rf_image)
    {
        .data = dst,
        .width = width,
        .height = height,
        .format = RF_UNCOMPRESSED_R8G8B8A8,
        .valid = true,
    };

    return result;
}